

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O2

Persistence_landscape * __thiscall
Gudhi::Persistence_representations::operation_on_pair_of_landscapes<std::plus<double>>
          (Persistence_landscape *__return_storage_ptr__,Persistence_representations *this,
          Persistence_landscape *land1,Persistence_landscape *land2)

{
  double dVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  pointer pvVar10;
  pointer pvVar11;
  ulong uVar12;
  ulong uVar13;
  size_t i;
  long lVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  double dVar18;
  _Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_a8;
  pair<double,_double> local_88;
  Persistence_representations *local_78;
  long local_70;
  ulong local_68;
  Persistence_landscape *local_60;
  ulong local_58;
  ulong local_50;
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  land;
  
  (__return_storage_ptr__->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->number_of_functions_for_vectorization = 0;
  __return_storage_ptr__->number_of_functions_for_projections_to_reals = 0;
  (__return_storage_ptr__->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->land).
  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar5 = (*(long *)(this + 8) - *(long *)this) / 0x18;
  uVar6 = ((long)(land1->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(land1->land).
                super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  if (uVar5 <= uVar6) {
    uVar5 = uVar6;
  }
  local_78 = this;
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::vector(&land,uVar5,(allocator_type *)&local_a8);
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::operator=(&__return_storage_ptr__->land,&land);
  uVar5 = 0;
  local_60 = land1;
LAB_0010bcfd:
  lVar9 = *(long *)local_78;
  lVar15 = *(long *)(local_78 + 8);
  uVar12 = lVar15 - lVar9;
  uVar7 = (long)uVar12 / 0x18;
  pvVar10 = (land1->land).
            super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar11 = (land1->land).
            super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar13 = (long)pvVar11 - (long)pvVar10;
  uVar8 = (long)uVar13 / 0x18;
  uVar6 = uVar7;
  if (uVar8 < uVar7) {
    uVar6 = uVar8;
  }
  if (uVar5 == uVar6) {
    if (uVar8 < uVar7) {
      while( true ) {
        uVar12 = lVar15 - lVar9;
        uVar13 = (long)pvVar11 - (long)pvVar10;
        uVar5 = (long)uVar13 / 0x18;
        if ((ulong)((long)uVar13 / 0x18) < (ulong)((long)uVar12 / 0x18)) {
          uVar5 = (long)uVar12 / 0x18;
        }
        if (uVar8 == uVar5) break;
        lVar15 = uVar8 * 0x18;
        std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
                  ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *
                   )&local_a8,
                   (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *
                   )(lVar9 + lVar15));
        lVar9 = *(long *)(*(long *)local_78 + lVar15);
        lVar16 = *(long *)(*(long *)local_78 + 8 + lVar15) - lVar9 >> 4;
        lVar15 = 8;
        while (bVar17 = lVar16 != 0, lVar16 = lVar16 + -1, bVar17) {
          dVar1 = *(double *)(lVar9 + lVar15);
          *(undefined8 *)((long)local_a8._M_impl.super__Vector_impl_data._M_start + lVar15 + -8) =
               *(undefined8 *)(lVar9 + -8 + lVar15);
          *(double *)((long)&(local_a8._M_impl.super__Vector_impl_data._M_start)->first + lVar15) =
               dVar1 + 0.0;
          lVar15 = lVar15 + 0x10;
        }
        pvVar10 = (__return_storage_ptr__->land).
                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar2 = *(pointer *)
                  ((long)&pvVar10[uVar8].
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl + 0x10);
        ppVar3 = *(pointer *)
                  &pvVar10[uVar8].
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl;
        ppVar4 = *(pointer *)
                  ((long)&pvVar10[uVar8].
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl + 8);
        *(pointer *)
         &pvVar10[uVar8].
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl = local_a8._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&pvVar10[uVar8].
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl + 8) = local_a8._M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&pvVar10[uVar8].
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl + 0x10) = local_a8._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_a8._M_impl.super__Vector_impl_data._M_start = ppVar3;
        local_a8._M_impl.super__Vector_impl_data._M_finish = ppVar4;
        local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar2;
        std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
        ~_Vector_base(&local_a8);
        uVar8 = uVar8 + 1;
        lVar9 = *(long *)local_78;
        lVar15 = *(long *)(local_78 + 8);
        pvVar10 = (land1->land).
                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar11 = (land1->land).
                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    if (uVar12 < uVar13) {
      uVar12 = (long)uVar12 / 0x18;
      while( true ) {
        uVar6 = (lVar15 - lVar9) / 0x18;
        uVar5 = ((long)pvVar11 - (long)pvVar10) / 0x18;
        if (uVar5 < uVar6) {
          uVar5 = uVar6;
        }
        if (uVar12 == uVar5) break;
        std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
                  ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *
                   )&local_a8,pvVar10 + uVar12);
        pvVar10 = (local_60->land).
                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar9 = *(long *)&pvVar10[uVar12].
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl;
        lVar16 = (long)*(pointer *)
                        ((long)&pvVar10[uVar12].
                                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                ._M_impl + 8) - lVar9 >> 4;
        lVar15 = 8;
        while (bVar17 = lVar16 != 0, lVar16 = lVar16 + -1, bVar17) {
          dVar1 = *(double *)(lVar9 + lVar15);
          *(undefined8 *)((long)local_a8._M_impl.super__Vector_impl_data._M_start + lVar15 + -8) =
               *(undefined8 *)(lVar9 + -8 + lVar15);
          *(double *)((long)&(local_a8._M_impl.super__Vector_impl_data._M_start)->first + lVar15) =
               dVar1 + 0.0;
          lVar15 = lVar15 + 0x10;
        }
        pvVar10 = (__return_storage_ptr__->land).
                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar2 = *(pointer *)
                  ((long)&pvVar10[uVar12].
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl + 0x10);
        ppVar3 = *(pointer *)
                  &pvVar10[uVar12].
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl;
        ppVar4 = *(pointer *)
                  ((long)&pvVar10[uVar12].
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl + 8);
        *(pointer *)
         &pvVar10[uVar12].
          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          ._M_impl = local_a8._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&pvVar10[uVar12].
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl + 8) = local_a8._M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&pvVar10[uVar12].
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ._M_impl + 0x10) = local_a8._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_a8._M_impl.super__Vector_impl_data._M_start = ppVar3;
        local_a8._M_impl.super__Vector_impl_data._M_finish = ppVar4;
        local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar2;
        std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
        ~_Vector_base(&local_a8);
        uVar12 = uVar12 + 1;
        lVar9 = *(long *)local_78;
        lVar15 = *(long *)(local_78 + 8);
        pvVar10 = (local_60->land).
                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar11 = (local_60->land).
                  super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    std::
    vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
    ::~vector(&land);
    return __return_storage_ptr__;
  }
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = 1;
  local_70 = 8;
  uVar7 = 0;
  uVar6 = 0;
  local_58 = uVar5;
  do {
    local_50 = uVar6 + 1;
    do {
      uVar13 = uVar7 << 4 | 8;
      uVar12 = uVar5;
      uVar8 = uVar7;
      while( true ) {
        uVar5 = local_58;
        land1 = local_60;
        uVar8 = uVar8 + 1;
        lVar16 = uVar12 * 0x18;
        lVar9 = *(long *)(*(long *)local_78 + lVar16);
        lVar15 = *(long *)(*(long *)local_78 + 8 + lVar16);
        if (((ulong)(lVar15 - lVar9 >> 4) <= uVar7 + 1) ||
           (pvVar10 = (local_60->land).
                      super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
           lVar14 = *(long *)&pvVar10[uVar12].
                              super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                              ._M_impl,
           (ulong)((long)*(pointer *)
                          ((long)&pvVar10[uVar12].
                                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                  ._M_impl + 8) - lVar14 >> 4) <= local_50)) goto LAB_0010bf29;
        dVar1 = *(double *)(lVar9 + -8 + uVar13);
        lVar15 = lVar14 + uVar6 * 0x10;
        local_88.first = *(double *)(lVar14 + uVar6 * 0x10);
        if (local_88.first <= dVar1) break;
        dVar18 = (*(double *)(lVar15 + 8) - *(double *)(lVar15 + -8)) /
                 (local_88.first - *(double *)(lVar15 + -0x10));
        local_88.second =
             dVar18 * dVar1 + (*(double *)(lVar15 + -8) - *(double *)(lVar15 + -0x10) * dVar18) +
             *(double *)(lVar9 + uVar13);
        local_88.first = dVar1;
        std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
        emplace_back<std::pair<double,double>>
                  ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                   &local_a8,&local_88);
        uVar13 = uVar13 + 0x10;
        uVar7 = uVar7 + 1;
        uVar12 = local_58;
      }
      if (local_88.first < dVar1) {
        dVar18 = (*(double *)(lVar9 + -0x10 + uVar13) - *(double *)(lVar9 + uVar13)) /
                 (*(double *)(lVar9 + -0x18 + uVar13) - dVar1);
        local_88.second =
             dVar18 * local_88.first + (*(double *)(lVar9 + uVar13) - dVar1 * dVar18) +
             *(double *)(lVar15 + 8);
        std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
        emplace_back<std::pair<double,double>>
                  ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                   &local_a8,&local_88);
        goto LAB_0010bf09;
      }
    } while ((dVar1 != local_88.first) || (NAN(dVar1) || NAN(local_88.first)));
    local_88.second = *(double *)(lVar9 + uVar13) + *(double *)(lVar15 + 8);
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<std::pair<double,double>>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               &local_a8,&local_88);
    uVar7 = uVar7 + 1;
LAB_0010bf09:
    local_70 = local_70 + 0x10;
    local_68 = local_68 + 1;
    uVar6 = local_50;
  } while( true );
LAB_0010bf29:
  while ((uVar8 < (ulong)(lVar15 - lVar9 >> 4) &&
         (pvVar10 = (land1->land).
                    super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         (ulong)((long)*(pointer *)
                        ((long)&pvVar10[uVar12].
                                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                ._M_impl + 8) -
                 *(long *)&pvVar10[uVar12].
                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           ._M_impl >> 4) <= local_50))) {
    local_88.second = *(double *)(lVar9 + uVar13) + 0.0;
    local_88.first = *(double *)(lVar9 + -8 + uVar13);
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<std::pair<double,double>>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               &local_a8,&local_88);
    lVar9 = *(long *)(*(long *)local_78 + lVar16);
    lVar15 = *(long *)(*(long *)local_78 + 8 + lVar16);
    uVar13 = uVar13 + 0x10;
    uVar8 = uVar8 + 1;
  }
  lVar14 = local_70;
  for (uVar5 = local_68;
      ((ulong)(lVar15 - lVar9 >> 4) <= uVar8 &&
      (pvVar10 = (land1->land).
                 super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
      lVar9 = *(long *)&pvVar10[uVar12].
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl,
      uVar5 < (ulong)((long)*(pointer *)
                             ((long)&pvVar10[uVar12].
                                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     ._M_impl + 8) - lVar9 >> 4))); uVar5 = uVar5 + 1) {
    local_88.second = *(double *)(lVar9 + lVar14) + 0.0;
    local_88.first = *(double *)(lVar9 + -8 + lVar14);
    std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
    emplace_back<std::pair<double,double>>
              ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
               &local_a8,&local_88);
    lVar9 = *(long *)(*(long *)local_78 + lVar16);
    lVar15 = *(long *)(*(long *)local_78 + 8 + lVar16);
    lVar14 = lVar14 + 0x10;
  }
  local_88.first = 2147483647.0;
  local_88.second = 0.0;
  std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
  emplace_back<std::pair<double,double>>
            ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)&local_a8,
             &local_88);
  pvVar10 = (__return_storage_ptr__->land).
            super__Vector_base<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = *(pointer *)
            ((long)&pvVar10[uVar12].
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl + 0x10);
  ppVar3 = *(pointer *)
            &pvVar10[uVar12].
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl;
  ppVar4 = *(pointer *)
            ((long)&pvVar10[uVar12].
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl + 8);
  *(pointer *)
   &pvVar10[uVar12].
    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
    _M_impl = local_a8._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&pvVar10[uVar12].
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl + 8) = local_a8._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&pvVar10[uVar12].
           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
           ._M_impl + 0x10) = local_a8._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a8._M_impl.super__Vector_impl_data._M_start = ppVar3;
  local_a8._M_impl.super__Vector_impl_data._M_finish = ppVar4;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar2;
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&local_a8);
  uVar5 = local_58 + 1;
  goto LAB_0010bcfd;
}

Assistant:

Persistence_landscape operation_on_pair_of_landscapes(const Persistence_landscape& land1,
                                                      const Persistence_landscape& land2) {
  bool operation_on_pair_of_landscapesDBG = false;
  if (operation_on_pair_of_landscapesDBG) {
    std::clog << "operation_on_pair_of_landscapes\n";
    std::cin.ignore();
  }
  Persistence_landscape result;
  std::vector<std::vector<std::pair<double, double> > > land(std::max(land1.land.size(), land2.land.size()));
  result.land = land;
  T oper;

  if (operation_on_pair_of_landscapesDBG) {
    for (size_t i = 0; i != std::min(land1.land.size(), land2.land.size()); ++i) {
      std::clog << "land1.land[" << i << "].size() : " << land1.land[i].size() << std::endl;
      std::clog << "land2.land[" << i << "].size() : " << land2.land[i].size() << std::endl;
    }
    getchar();
  }

  for (size_t i = 0; i != std::min(land1.land.size(), land2.land.size()); ++i) {
    std::vector<std::pair<double, double> > lambda_n;
    size_t p = 0;
    size_t q = 0;
    while ((p + 1 < land1.land[i].size()) && (q + 1 < land2.land[i].size())) {
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "p : " << p << "\n";
        std::clog << "q : " << q << "\n";
        std::clog << "land1.land.size() : " << land1.land.size() << std::endl;
        std::clog << "land2.land.size() : " << land2.land.size() << std::endl;
        std::clog << "land1.land[" << i << "].size() : " << land1.land[i].size() << std::endl;
        std::clog << "land2.land[" << i << "].size() : " << land2.land[i].size() << std::endl;
        std::clog << "land1.land[i][p].first : " << land1.land[i][p].first << "\n";
        std::clog << "land2.land[i][q].first : " << land2.land[i][q].first << "\n";
      }

      if (land1.land[i][p].first < land2.land[i][q].first) {
        if (operation_on_pair_of_landscapesDBG) {
          std::clog << "first \n";
          std::clog << " function_value(land2.land[i][q-1],land2.land[i][q],land1.land[i][p].first) : "
                    << function_value(land2.land[i][q - 1], land2.land[i][q], land1.land[i][p].first) << "\n";
        }
        lambda_n.push_back(
            std::make_pair(land1.land[i][p].first,
                           oper(static_cast<double>(land1.land[i][p].second),
                                function_value(land2.land[i][q - 1], land2.land[i][q], land1.land[i][p].first))));
        ++p;
        continue;
      }
      if (land1.land[i][p].first > land2.land[i][q].first) {
        if (operation_on_pair_of_landscapesDBG) {
          std::clog << "Second \n";
          std::clog << "function_value(" << land1.land[i][p - 1].first << " " << land1.land[i][p - 1].second << " ,"
                    << land1.land[i][p].first << " " << land1.land[i][p].second << ", " << land2.land[i][q].first
                    << " ) : " << function_value(land1.land[i][p - 1], land1.land[i][p - 1], land2.land[i][q].first)
                    << "\n";
          std::clog << "oper( " << function_value(land1.land[i][p], land1.land[i][p - 1], land2.land[i][q].first) << ","
                    << land2.land[i][q].second << " : "
                    << oper(land2.land[i][q].second,
                            function_value(land1.land[i][p], land1.land[i][p - 1], land2.land[i][q].first))
                    << "\n";
        }
        lambda_n.push_back(std::make_pair(
            land2.land[i][q].first, oper(function_value(land1.land[i][p], land1.land[i][p - 1], land2.land[i][q].first),
                                         land2.land[i][q].second)));
        ++q;
        continue;
      }
      if (land1.land[i][p].first == land2.land[i][q].first) {
        if (operation_on_pair_of_landscapesDBG) std::clog << "Third \n";
        lambda_n.push_back(
            std::make_pair(land2.land[i][q].first, oper(land1.land[i][p].second, land2.land[i][q].second)));
        ++p;
        ++q;
      }
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "Next iteration \n";
      }
    }
    while ((p + 1 < land1.land[i].size()) && (q + 1 >= land2.land[i].size())) {
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "New point : " << land1.land[i][p].first
                  << "  oper(land1.land[i][p].second,0) : " << oper(land1.land[i][p].second, 0) << std::endl;
      }
      lambda_n.push_back(std::make_pair(land1.land[i][p].first, oper(land1.land[i][p].second, 0)));
      ++p;
    }
    while ((p + 1 >= land1.land[i].size()) && (q + 1 < land2.land[i].size())) {
      if (operation_on_pair_of_landscapesDBG) {
        std::clog << "New point : " << land2.land[i][q].first
                  << " oper(0,land2.land[i][q].second) : " << oper(0, land2.land[i][q].second) << std::endl;
      }
      lambda_n.push_back(std::make_pair(land2.land[i][q].first, oper(0, land2.land[i][q].second)));
      ++q;
    }
    lambda_n.push_back(std::make_pair(std::numeric_limits<int>::max(), 0));
    // CHANGE
    // result.land[i] = lambda_n;
    result.land[i].swap(lambda_n);
  }
  if (land1.land.size() > std::min(land1.land.size(), land2.land.size())) {
    if (operation_on_pair_of_landscapesDBG) {
      std::clog << "land1.land.size() > std::min( land1.land.size() , land2.land.size() )" << std::endl;
    }
    for (size_t i = std::min(land1.land.size(), land2.land.size()); i != std::max(land1.land.size(), land2.land.size());
         ++i) {
      std::vector<std::pair<double, double> > lambda_n(land1.land[i]);
      for (size_t nr = 0; nr != land1.land[i].size(); ++nr) {
        lambda_n[nr] = std::make_pair(land1.land[i][nr].first, oper(land1.land[i][nr].second, 0));
      }
      // CHANGE
      // result.land[i] = lambda_n;
      result.land[i].swap(lambda_n);
    }
  }
  if (land2.land.size() > std::min(land1.land.size(), land2.land.size())) {
    if (operation_on_pair_of_landscapesDBG) {
      std::clog << "( land2.land.size() > std::min( land1.land.size() , land2.land.size() ) ) " << std::endl;
    }
    for (size_t i = std::min(land1.land.size(), land2.land.size()); i != std::max(land1.land.size(), land2.land.size());
         ++i) {
      std::vector<std::pair<double, double> > lambda_n(land2.land[i]);
      for (size_t nr = 0; nr != land2.land[i].size(); ++nr) {
        lambda_n[nr] = std::make_pair(land2.land[i][nr].first, oper(0, land2.land[i][nr].second));
      }
      // CHANGE
      // result.land[i] = lambda_n;
      result.land[i].swap(lambda_n);
    }
  }
  if (operation_on_pair_of_landscapesDBG) {
    std::clog << "operation_on_pair_of_landscapes END\n";
    std::cin.ignore();
  }
  return result;
}